

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O1

void printInmate(Inmate *inmate)

{
  char *__s;
  
  switch(inmate->type) {
  case 'a':
    __s = "unit:\t Attorney";
    break;
  case 'b':
    __s = "unit:\t Bruiser";
    break;
  case 'c':
    __s = "unit:\t Cutie";
    break;
  case 'd':
    __s = "unit:\t Doctor";
    break;
  case 'e':
  case 'g':
  case 'i':
  case 'j':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
    goto switchD_00104ece_caseD_65;
  case 'f':
    __s = "unit:\t Fatty";
    break;
  case 'h':
    __s = "unit:\t Homeboy";
    break;
  case 'l':
    __s = "unit:\t Lunatic";
    break;
  case 's':
    __s = "unit:\t Speedy";
    break;
  default:
    if (inmate->type != '\0') goto switchD_00104ece_caseD_65;
    __s = "unit:\t Protagonist";
  }
  puts(__s);
switchD_00104ece_caseD_65:
  printf("pos:\t%f\n",(double)inmate->position);
  printf("curHP:\t%d\n",(ulong)inmate->currentHealth);
  printf("maxHP:\t%d\n",(ulong)inmate->maxHealth);
  printf("speed:\t%d\n",(ulong)inmate->speed);
  printf("rep:\t%d\n",(ulong)inmate->rep);
  printf("panic:\t%d\n",(ulong)inmate->panic);
  putchar(10);
  return;
}

Assistant:

void printInmate(struct Inmate *inmate) {

    switch (inmate->type) {
        case PROTAGONIST:
            printf("unit:\t Protagonist\n");
            break;

        case HOMEBOY:
            printf("unit:\t Homeboy\n");
            break;

        case BRUISER:
            printf("unit:\t Bruiser\n");
            break;

        case LUNATIC:
            printf("unit:\t Lunatic\n");
            break;

        case FATTY:
            printf("unit:\t Fatty\n");
            break;

        case SPEEDY:
            printf("unit:\t Speedy\n");
            break;

        case CUTIE:
            printf("unit:\t Cutie\n");
            break;

        case ATTORNEY:
            printf("unit:\t Attorney\n");
            break;

        case DOCTOR:
            printf("unit:\t Doctor\n");
            break;

        default:
            break;
    }

    printf("pos:\t%f\n", inmate->position);
    printf("curHP:\t%d\n", inmate->currentHealth);
    printf("maxHP:\t%d\n", inmate->maxHealth);
    printf("speed:\t%d\n", inmate->speed);
    printf("rep:\t%d\n", inmate->rep);
    printf("panic:\t%d\n", inmate->panic);
    printf("\n");

    return;
}